

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

ISEParams tcu::astc::anon_unknown_0::computeMaximumRangeISEParams
                    (int numAvailableBits,int numValuesInSequence)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  
  uVar2 = 6;
  uVar4 = 5;
  uVar6 = 8;
  uVar7 = 0;
  do {
    uVar5 = ~(-1 << ((byte)uVar6 & 0x1f));
    if ((int)uVar6 < 1) {
      uVar5 = 0xffffffff;
    }
    while( true ) {
      uVar1 = (5 << ((byte)uVar4 & 0x1f)) - 1;
      if ((int)uVar4 < 1) {
        uVar1 = 0xffffffff;
      }
      iVar9 = numValuesInSequence * uVar2 +
              (((numValuesInSequence * 8) / 5 + 1) -
              (uint)(numValuesInSequence * 0x66666668 + 0x19999999U < 0x33333333));
      while( true ) {
        uVar8 = (3 << ((byte)uVar2 & 0x1f)) - 1;
        if ((int)uVar2 < 1) {
          uVar8 = 0xffffffff;
        }
        uVar3 = uVar1;
        if ((int)uVar1 < (int)uVar8) {
          uVar3 = uVar8;
        }
        if ((int)uVar3 <= (int)uVar5) {
          uVar3 = uVar5;
        }
        if (uVar3 != uVar8) break;
        if (iVar9 <= numAvailableBits) goto LAB_00a52654;
        uVar2 = uVar2 - 1;
        iVar9 = iVar9 - numValuesInSequence;
      }
      if (uVar3 != uVar1) break;
      if ((int)(uVar4 * numValuesInSequence +
               (((numValuesInSequence * 7) / 3 + 1) -
               (uint)(numValuesInSequence * -0x55555553 + 0x2aaaaaaaU < 0x55555555))) <=
          numAvailableBits) {
        uVar7 = 1;
        uVar2 = uVar4;
        goto LAB_00a52654;
      }
      uVar4 = uVar4 - 1;
    }
    if ((int)(uVar6 * numValuesInSequence) <= numAvailableBits) {
      uVar7 = 2;
      uVar2 = uVar6;
LAB_00a52654:
      return (ISEParams)((ulong)uVar2 << 0x20 | uVar7);
    }
    uVar6 = uVar6 - 1;
  } while( true );
}

Assistant:

ISEParams computeMaximumRangeISEParams (int numAvailableBits, int numValuesInSequence)
{
	int curBitsForTritMode		= 6;
	int curBitsForQuintMode		= 5;
	int curBitsForPlainBitMode	= 8;

	while (true)
	{
		DE_ASSERT(curBitsForTritMode > 0 || curBitsForQuintMode > 0 || curBitsForPlainBitMode > 0);

		const int tritRange			= curBitsForTritMode > 0		? (3 << curBitsForTritMode) - 1			: -1;
		const int quintRange		= curBitsForQuintMode > 0		? (5 << curBitsForQuintMode) - 1		: -1;
		const int plainBitRange		= curBitsForPlainBitMode > 0	? (1 << curBitsForPlainBitMode) - 1		: -1;
		const int maxRange			= de::max(de::max(tritRange, quintRange), plainBitRange);

		if (maxRange == tritRange)
		{
			const ISEParams params(ISEMODE_TRIT, curBitsForTritMode);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_TRIT, curBitsForTritMode);
			curBitsForTritMode--;
		}
		else if (maxRange == quintRange)
		{
			const ISEParams params(ISEMODE_QUINT, curBitsForQuintMode);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_QUINT, curBitsForQuintMode);
			curBitsForQuintMode--;
		}
		else
		{
			const ISEParams params(ISEMODE_PLAIN_BIT, curBitsForPlainBitMode);
			DE_ASSERT(maxRange == plainBitRange);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_PLAIN_BIT, curBitsForPlainBitMode);
			curBitsForPlainBitMode--;
		}
	}
}